

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O2

void __thiscall OpenMD::COHZ::computeFrame(COHZ *this,int frame)

{
  double dVar1;
  Mat3x3d hmat;
  Mat3x3d MStack_58;
  
  Snapshot::getHmat(&MStack_58,
                    (this->super_MoleculeACF<OpenMD::Vector<double,_4U>_>).
                    super_AutoCorrFunc<OpenMD::Vector<double,_4U>_>.
                    super_TimeCorrFunc<OpenMD::Vector<double,_4U>_>.currentSnapshot_);
  dVar1 = *(double *)
           ((long)MStack_58.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_ +
           (ulong)(uint)this->axis_ * 0x20);
  this->boxZ_ = dVar1;
  this->halfBoxZ_ = dVar1 * 0.5;
  TimeCorrFunc<OpenMD::Vector<double,_4U>_>::computeFrame
            ((TimeCorrFunc<OpenMD::Vector<double,_4U>_> *)this,frame);
  return;
}

Assistant:

void COHZ::computeFrame(int frame) {
    Mat3x3d hmat = currentSnapshot_->getHmat();
    boxZ_        = hmat(axis_, axis_);
    halfBoxZ_    = boxZ_ / 2.0;

    MoleculeACF<Vector<RealType, 4>>::computeFrame(frame);
  }